

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

AssertionResult
testing::internal::CmpHelperSTRNE(char *s1_expression,char *s2_expression,wchar_t *s1,wchar_t *s2)

{
  int iVar1;
  AssertionResult *pAVar2;
  wchar_t *in_RCX;
  undefined8 in_RDX;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  wchar_t **value;
  wchar_t **value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult *in_RDI;
  wchar_t *in_R8;
  AssertionResult AVar4;
  testing local_88 [8];
  testing local_80 [8];
  char *local_78;
  char *local_70;
  string local_68;
  string local_48;
  AssertionResult local_28;
  
  sVar3.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT71((int7)((ulong)in_RDX >> 8),
                        in_R8 == (wchar_t *)0x0 || in_RCX == (wchar_t *)0x0);
  if (in_R8 == (wchar_t *)0x0 || in_RCX == (wchar_t *)0x0) {
    if (in_RCX != (wchar_t *)0x0 || in_R8 != (wchar_t *)0x0) {
LAB_00122485:
      in_RDI->success_ = true;
      (in_RDI->message_).ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      goto LAB_00122491;
    }
  }
  else {
    iVar1 = wcscmp(in_RCX,in_R8);
    sVar3.ptr_ = extraout_RDX_00;
    if (iVar1 != 0) goto LAB_00122485;
  }
  local_28.success_ = false;
  local_28.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  pAVar2 = AssertionResult::operator<<(&local_28,(char (*) [12])"Expected: (");
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_70);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [7])") != (");
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_78);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"), actual: ");
  PrintToString<wchar_t_const*>(&local_48,local_80,value);
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_48);
  pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])" vs ");
  PrintToString<wchar_t_const*>(&local_68,local_88,value_00);
  pAVar2 = AssertionResult::operator<<(pAVar2,&local_68);
  AssertionResult::AssertionResult(in_RDI,pAVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  sVar3.ptr_ = extraout_RDX;
LAB_00122491:
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = in_RDI;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperSTRNE(const char* s1_expression,
                               const char* s2_expression,
                               const wchar_t* s1,
                               const wchar_t* s2) {
  if (!String::WideCStringEquals(s1, s2)) {
    return AssertionSuccess();
  }

  return AssertionFailure() << "Expected: (" << s1_expression << ") != ("
                            << s2_expression << "), actual: "
                            << PrintToString(s1)
                            << " vs " << PrintToString(s2);
}